

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

RTMatrix4x4 * __thiscall
RTMatrix4x4::transposed(RTMatrix4x4 *__return_storage_ptr__,RTMatrix4x4 *this)

{
  int local_18;
  int local_14;
  int col;
  int row;
  RTMatrix4x4 *this_local;
  
  RTMatrix4x4(__return_storage_ptr__);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      __return_storage_ptr__->m_data[local_18][local_14] = this->m_data[local_14][local_18];
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RTMatrix4x4 RTMatrix4x4::transposed()
{
    RTMatrix4x4 res;

    for (int row = 0; row < 4; row++)
        for (int col = 0; col < 4; col++)
            res.m_data[col][row] = m_data[row][col];
    return res;
}